

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

int nk_utf_decode(char *c,nk_rune *u,int clen)

{
  nk_rune nVar1;
  nk_rune local_38;
  int local_34;
  nk_rune udecoded;
  int type;
  int len;
  int j;
  int i;
  int clen_local;
  nk_rune *u_local;
  char *c_local;
  
  local_34 = 0;
  j = clen;
  _i = u;
  u_local = (nk_rune *)c;
  if (c == (char *)0x0) {
    __assert_fail("c",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x1e80,"int nk_utf_decode(const char *, nk_rune *, int)");
  }
  if (u != (nk_rune *)0x0) {
    if ((c == (char *)0x0) || (u == (nk_rune *)0x0)) {
      c_local._4_4_ = 0;
    }
    else if (clen == 0) {
      c_local._4_4_ = 0;
    }
    else {
      *u = 0xfffd;
      local_38 = nk_utf_decode_byte(*c,(int *)&udecoded);
      if (((int)udecoded < 1) || (3 < (int)udecoded)) {
        c_local._4_4_ = 1;
      }
      else {
        type = 1;
        for (len = 1; len < j && type < (int)udecoded; len = len + 1) {
          nVar1 = nk_utf_decode_byte(*(char *)((long)u_local + (long)len),&local_34);
          local_38 = local_38 << 6 | nVar1;
          if (local_34 != 0) {
            return type;
          }
          type = type + 1;
        }
        if (type < (int)udecoded) {
          c_local._4_4_ = 0;
        }
        else {
          *_i = local_38;
          nk_utf_validate(_i,udecoded);
          c_local._4_4_ = udecoded;
        }
      }
    }
    return c_local._4_4_;
  }
  __assert_fail("u",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                ,0x1e81,"int nk_utf_decode(const char *, nk_rune *, int)");
}

Assistant:

NK_API int
nk_utf_decode(const char *c, nk_rune *u, int clen)
{
    int i, j, len, type=0;
    nk_rune udecoded;

    NK_ASSERT(c);
    NK_ASSERT(u);

    if (!c || !u) return 0;
    if (!clen) return 0;
    *u = NK_UTF_INVALID;

    udecoded = nk_utf_decode_byte(c[0], &len);
    if (!NK_BETWEEN(len, 1, NK_UTF_SIZE))
        return 1;

    for (i = 1, j = 1; i < clen && j < len; ++i, ++j) {
        udecoded = (udecoded << 6) | nk_utf_decode_byte(c[i], &type);
        if (type != 0)
            return j;
    }
    if (j < len)
        return 0;
    *u = udecoded;
    nk_utf_validate(u, len);
    return len;
}